

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O2

void __thiscall QWhatsThisPrivate::QWhatsThisPrivate(QWhatsThisPrivate *this)

{
  byte bVar1;
  QWidget *this_00;
  long in_FS_OFFSET;
  QPoint local_58;
  QPoint local_50;
  QCursor local_48;
  undefined8 uStack_40;
  QWhatsThisPrivate *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject(&this->super_QObject,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_007c6ce0;
  (this->action).wp.d = (Data *)0x0;
  (this->action).wp.value = (QObject *)0x0;
  this->leaveOnMouseRelease = false;
  instance = this;
  QObject::installEventFilter(QCoreApplication::self);
  local_50 = (QPoint)QCursor::pos();
  this_00 = QApplication::widgetAt(&local_50);
  if (this_00 == (QWidget *)0x0) {
    QCursor::QCursor(&local_48,WhatsThisCursor);
    QGuiApplication::setOverrideCursor(&local_48);
    QCursor::~QCursor(&local_48);
  }
  else {
    local_38 = (QWhatsThisPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (QCursorData *)&DAT_aaaaaaaaaaaaaaaa;
    uStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = QWidget::mapFromGlobal(this_00,&local_50);
    QHelpEvent::QHelpEvent((QHelpEvent *)&local_48,QueryWhatsThis,&local_58,&local_50);
    bVar1 = QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_48);
    QCursor::QCursor((QCursor *)&local_58,bVar1 & uStack_40._4_1_ | ForbiddenCursor);
    QGuiApplication::setOverrideCursor((QCursor *)&local_58);
    QCursor::~QCursor((QCursor *)&local_58);
    QHelpEvent::~QHelpEvent((QHelpEvent *)&local_48);
  }
  local_48.d = (QCursorData *)QFont::strikeOut;
  uStack_40 = (undefined1 *)0xaaaaaaaa0000000c;
  puStack_30 = (undefined1 *)0xaaaaaaaaffffffff;
  local_38 = this;
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWhatsThisPrivate::QWhatsThisPrivate()
    : leaveOnMouseRelease(false)
{
    instance = this;
    qApp->installEventFilter(this);

    QPoint pos = QCursor::pos();
    if (QWidget *w = QApplication::widgetAt(pos)) {
        QHelpEvent e(QEvent::QueryWhatsThis, w->mapFromGlobal(pos), pos);
        const bool sentEvent = QCoreApplication::sendEvent(w, &e);
#ifdef QT_NO_CURSOR
        Q_UNUSED(sentEvent);
#else
        QGuiApplication::setOverrideCursor((!sentEvent || !e.isAccepted())?
                                        Qt::ForbiddenCursor:Qt::WhatsThisCursor);
    } else {
        QGuiApplication::setOverrideCursor(Qt::WhatsThisCursor);
#endif
    }
#if QT_CONFIG(accessibility)
    QAccessibleEvent event(this, QAccessible::ContextHelpStart);
    QAccessible::updateAccessibility(&event);
#endif
}